

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O2

void __thiscall QL_NodeRel::~QL_NodeRel(QL_NodeRel *this)

{
  (this->super_QL_Node)._vptr_QL_Node = (_func_int **)&PTR_OpenIt_00124c20;
  if (this->relNameInitialized == true) {
    free(this->relName);
  }
  this->relNameInitialized = false;
  if ((this->super_QL_Node).listsInitialized == true) {
    free((this->super_QL_Node).attrsInRec);
  }
  (this->super_QL_Node).listsInitialized = false;
  IX_IndexScan::~IX_IndexScan(&this->is);
  RM_FileScan::~RM_FileScan(&this->fs);
  IX_IndexHandle::~IX_IndexHandle(&this->ih);
  RM_FileHandle::~RM_FileHandle(&this->fh);
  QL_Node::~QL_Node(&this->super_QL_Node);
  return;
}

Assistant:

QL_NodeRel::~QL_NodeRel(){
  if(relNameInitialized == true){
    free(relName);
  }
  relNameInitialized = false;
  if(listsInitialized == true){
    free(attrsInRec);
  }
  listsInitialized = false;
}